

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_WaitForExit(cmsysProcess *cp,double *userTimeout)

{
  uint uVar1;
  int iVar2;
  uint sig;
  
  iVar2 = 1;
  if ((cp != (cmsysProcess *)0x0) && (cp->State == 3)) {
    do {
      iVar2 = cmsysProcess_WaitForData(cp,(char **)0x0,(int *)0x0,userTimeout);
      if (iVar2 < 1) {
        if (cp->State != 1) {
          if (cp->SelectError != 0) {
            kwsysProcessCleanup(cp,0);
            cp->State = 1;
            return 1;
          }
          if (cp->Killed == 0) {
            if (cp->TimeoutExpired == 0) {
              uVar1 = cp->CommandExitCodes[(long)cp->NumberOfCommands + -1];
              sig = uVar1 & 0x7f;
              if (sig == 0) {
                cp->State = 4;
                cp->ExitException = 0;
                cp->ExitCode = uVar1;
                cp->ExitValue = uVar1 >> 8 & 0xff;
              }
              else if ((int)(sig * 0x1000000 + 0x1000000) < 0x2000000) {
                builtin_strncpy(cp->ErrorMessage,"Error getting child return code.",0x21);
                cp->State = 1;
              }
              else {
                cp->State = 2;
                cp->ExitCode = uVar1;
                kwsysProcessSetExitException(cp,sig);
              }
            }
            else {
              cp->State = 5;
            }
          }
          else {
            cp->State = 6;
          }
        }
        kwsysProcessCleanup(cp,0);
        return 1;
      }
    } while (iVar2 != 0xff);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int kwsysProcess_WaitForExit(kwsysProcess* cp, double* userTimeout)
{
  int status = 0;
  int prPipe = 0;

  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing)
    {
    return 1;
    }

  /* Wait for all the pipes to close.  Ignore all data.  */
  while((prPipe = kwsysProcess_WaitForData(cp, 0, 0, userTimeout)) > 0)
    {
    if(prPipe == kwsysProcess_Pipe_Timeout)
      {
      return 0;
      }
    }

  /* Check if there was an error in one of the waitpid calls.  */
  if(cp->State == kwsysProcess_State_Error)
    {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    return 1;
    }

  /* Check whether the child reported an error invoking the process.  */
  if(cp->SelectError)
    {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    cp->State = kwsysProcess_State_Error;
    return 1;
    }

  /* Use the status of the last process in the pipeline.  */
  status = cp->CommandExitCodes[cp->NumberOfCommands-1];

  /* Determine the outcome.  */
  if(cp->Killed)
    {
    /* We killed the child.  */
    cp->State = kwsysProcess_State_Killed;
    }
  else if(cp->TimeoutExpired)
    {
    /* The timeout expired.  */
    cp->State = kwsysProcess_State_Expired;
    }
  else if(WIFEXITED(status))
    {
    /* The child exited normally.  */
    cp->State = kwsysProcess_State_Exited;
    cp->ExitException = kwsysProcess_Exception_None;
    cp->ExitCode = status;
    cp->ExitValue = (int)WEXITSTATUS(status);
    }
  else if(WIFSIGNALED(status))
    {
    /* The child received an unhandled signal.  */
    cp->State = kwsysProcess_State_Exception;
    cp->ExitCode = status;
    kwsysProcessSetExitException(cp, (int)WTERMSIG(status));
    }
  else
    {
    /* Error getting the child return code.  */
    strcpy(cp->ErrorMessage, "Error getting child return code.");
    cp->State = kwsysProcess_State_Error;
    }

  /* Normal cleanup.  */
  kwsysProcessCleanup(cp, 0);
  return 1;
}